

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O1

int read_att_array(coda_netcdf_product *product,int64_t *offset,coda_mem_record **attributes,
                  coda_conversion *conversion)

{
  size_t __size;
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined5 uVar5;
  undefined1 uVar6;
  uint uVar7;
  coda_conversion *pcVar8;
  long length;
  int iVar9;
  coda_type_record *definition;
  coda_mem_record *pcVar10;
  coda_netcdf_basic_type *base_type;
  coda_netcdf_basic_type *field_type;
  double dVar11;
  double dVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  uint nc_type_00;
  int32_t nc_type;
  int32_t tag;
  float value;
  int64_t nelems;
  int64_t num_att;
  int64_t string_length;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  int local_6c;
  double local_68;
  long local_60;
  long local_58;
  double local_50;
  ulong local_48;
  coda_conversion *local_40;
  long local_38;
  
  iVar9 = read_bytes(product->raw_product,*offset,4,&local_bc);
  if (-1 < iVar9) {
    uVar6 = (undefined1)local_bc;
    uVar1 = local_bc._1_2_ << 8;
    uVar2 = local_bc._1_2_ >> 8;
    local_bc = CONCAT13(uVar6,CONCAT21(uVar1 | uVar2,local_bc._3_1_));
    *offset = *offset + 4;
    iVar9 = read_length_value(product,offset,&local_60);
    if (iVar9 == 0) {
      if (local_bc == 0xc) {
        definition = coda_type_record_new(coda_format_netcdf);
        if (definition != (coda_type_record *)0x0) {
          pcVar10 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
          *attributes = pcVar10;
          coda_type_release((coda_type *)definition);
          if (*attributes != (coda_mem_record *)0x0) {
            if (local_60 < 1) {
              return 0;
            }
            lVar14 = 0;
            local_40 = conversion;
            while (pcVar8 = local_40, iVar9 = read_length_value(product,offset,&local_38),
                  length = local_38, iVar9 == 0) {
              __size = local_38 + 1;
              local_58 = lVar14;
              pcVar15 = (char *)malloc(__size);
              if (pcVar15 == (char *)0x0) {
                coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                               "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                               ,0xf1);
                break;
              }
              pcVar15[length] = '\0';
              iVar9 = read_bytes(product->raw_product,*offset,length,pcVar15);
              if (iVar9 < 0) {
LAB_0016941c:
                free(pcVar15);
                break;
              }
              uVar13 = (ulong)((uint)length & 3);
              lVar14 = ((*offset + length) - uVar13) + 4;
              if (uVar13 == 0) {
                lVar14 = *offset + length;
              }
              *offset = lVar14;
              iVar9 = read_bytes(product->raw_product,lVar14,4,&local_c0);
              if (iVar9 < 0) goto LAB_0016941c;
              uVar6 = (undefined1)local_c0;
              uVar1 = local_c0._1_2_ << 8;
              uVar2 = local_c0._1_2_ >> 8;
              local_c0 = CONCAT13(uVar6,CONCAT21(uVar1 | uVar2,local_c0._3_1_));
              *offset = *offset + 4;
              iVar9 = read_length_value(product,offset,(int64_t *)&local_68);
              dVar12 = local_68;
              uVar7 = local_c0;
              if (iVar9 != 0) goto LAB_0016941c;
              uVar13 = (ulong)(local_c0 - 1);
              dVar11 = local_68;
              switch(uVar13) {
              case 0:
              case 1:
                break;
              case 2:
                dVar11 = (double)((long)local_68 * 2);
                break;
              case 3:
              case 4:
                dVar11 = (double)((long)local_68 * 4);
                break;
              case 5:
                dVar11 = (double)((long)local_68 * 8);
                break;
              default:
                coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))",(ulong)local_c0
                              );
                goto LAB_0016941c;
              }
              local_50 = dVar11;
              local_48 = uVar13;
              if (pcVar8 != (coda_conversion *)0x0) {
                if ((local_68 == 4.94065645841247e-324) &&
                   ((iVar9 = strcmp(pcVar15,"scale_factor"), iVar9 == 0 ||
                    (iVar9 = strcmp(pcVar15,"add_offset"), iVar9 == 0)))) {
                  if (uVar7 == 6) {
                    iVar9 = read_bytes(product->raw_product,*offset,8,&local_b8);
                    if (iVar9 < 0) {
                      local_6c = iVar9;
                      free(pcVar15);
                      coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                      iVar9 = local_6c;
                    }
                    else {
                      uVar1 = (ushort)local_b8 << 8;
                      uVar3 = (ushort)local_b8 >> 8;
                      uVar2 = local_b8._2_2_ << 8;
                      uVar4 = local_b8._2_2_ >> 8;
                      local_b8._0_4_ =
                           (float)CONCAT22(local_b8._4_2_ << 8 | local_b8._4_2_ >> 8,
                                           local_b8._6_2_ << 8 | local_b8._6_2_ >> 8);
                      local_b8 = (double)CONCAT26(uVar1 | uVar3,
                                                  CONCAT24(uVar2 | uVar4,(float)local_b8));
                      if (*pcVar15 == 's') {
                        pcVar8->numerator = local_b8;
                      }
                      else {
                        pcVar8->add_offset = local_b8;
                      }
                    }
                  }
                  else {
                    if (uVar7 != 5) goto LAB_00169071;
                    iVar9 = read_bytes(product->raw_product,*offset,4,&local_b8);
                    if (iVar9 < 0) {
                      local_6c = iVar9;
                      free(pcVar15);
                      coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                      iVar9 = local_6c;
                    }
                    else {
                      uVar5 = CONCAT41(local_b8._4_4_,(undefined1)local_b8);
                      uVar1 = local_b8._1_2_ << 8;
                      uVar2 = local_b8._1_2_ >> 8;
                      local_b8 = (double)CONCAT53(uVar5,CONCAT21(uVar1 | uVar2,local_b8._3_1_));
                      if (*pcVar15 == 's') {
                        pcVar8->numerator = (double)(float)local_b8;
                      }
                      else {
                        pcVar8->add_offset = (double)(float)local_b8;
                      }
                    }
                  }
                  if (iVar9 < 0) {
                    return -1;
                  }
                }
LAB_00169071:
                if ((uVar7 != 2 && dVar12 == 4.94065645841247e-324) &&
                   ((iVar9 = strcmp(pcVar15,"missing_value"), iVar9 == 0 ||
                    ((iVar9 = strcmp(pcVar15,"_FillValue"), iVar9 == 0 &&
                     (iVar9 = coda_isNaN(pcVar8->invalid_value), iVar9 != 0)))))) {
                  iVar9 = read_bytes(product->raw_product,*offset,(int64_t)local_50,&local_b8);
                  if (-1 < iVar9) {
                    if (10 < (uint)local_48) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                                    ,0x1af,
                                    "int read_att_array(coda_netcdf_product *, int64_t *, coda_mem_record **, coda_conversion *)"
                                   );
                    }
                    iVar9 = (*(code *)(&DAT_001ac558 + *(int *)(&DAT_001ac558 + local_48 * 4)))();
                    return iVar9;
                  }
                  free(pcVar15);
                  coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                  if (iVar9 < 0) {
                    return -1;
                  }
                }
              }
              uVar7 = local_c0;
              if (local_c0 == 2) {
                dVar12 = local_68;
                nc_type_00 = 2;
              }
              else {
                dVar12 = 4.94065645841247e-324;
                nc_type_00 = local_c0;
              }
              base_type = coda_netcdf_basic_type_new(nc_type_00,*offset,0,(int64_t)dVar12);
              if (base_type == (coda_netcdf_basic_type *)0x0) goto LAB_0016941c;
              uVar13 = (ulong)(SUB84(local_50,0) & 3);
              lVar14 = ((*offset + (long)local_50) - uVar13) + 4;
              if (uVar13 == 0) {
                lVar14 = *offset + (long)local_50;
              }
              *offset = lVar14;
              if (local_68 == 4.94065645841247e-324 || uVar7 == 2) {
                iVar9 = coda_mem_record_add_field
                                  (*attributes,pcVar15,(coda_dynamic_type *)base_type,1);
                if (iVar9 != 0) {
                  coda_dynamic_type_delete((coda_dynamic_type *)base_type);
                  goto LAB_0016941c;
                }
              }
              else {
                local_b8 = local_68;
                field_type = (coda_netcdf_basic_type *)coda_netcdf_array_new(1,&local_b8,base_type);
                if ((field_type == (coda_netcdf_basic_type *)0x0) ||
                   (iVar9 = coda_mem_record_add_field
                                      (*attributes,pcVar15,(coda_dynamic_type *)field_type,1),
                   base_type = field_type, iVar9 != 0)) {
                  coda_dynamic_type_delete((coda_dynamic_type *)base_type);
                  goto LAB_0016941c;
                }
              }
              lVar14 = local_58;
              free(pcVar15);
              lVar14 = lVar14 + 1;
              if (local_60 <= lVar14) {
                return 0;
              }
            }
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
          }
        }
      }
      else {
        if (local_bc == 0) {
          *attributes = (coda_mem_record *)0x0;
          if (local_60 == 0) {
            return 0;
          }
          pcVar15 = "invalid netCDF file (invalid value for nelems for empty att_array)";
        }
        else {
          pcVar15 = "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)";
        }
        coda_set_error(-300,pcVar15);
      }
    }
  }
  return -1;
}

Assistant:

static int read_att_array(coda_netcdf_product *product, int64_t *offset, coda_mem_record **attributes,
                          coda_conversion *conversion)
{
    coda_type_record *attributes_definition;
    int32_t tag;
    int64_t num_att;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_att) != 0)
    {
        return -1;
    }
    if (tag == 0)
    {
        *attributes = NULL;
        if (num_att != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty att_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 12)      /* NC_ATTRIBUTE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)");
        return -1;
    }

    attributes_definition = coda_type_record_new(coda_format_netcdf);
    if (attributes_definition == NULL)
    {
        return -1;
    }
    *attributes = coda_mem_record_new(attributes_definition, NULL);
    coda_type_release((coda_type *)attributes_definition);
    if (*attributes == NULL)
    {
        return -1;
    }

    for (i = 0; i < num_att; i++)
    {
        coda_netcdf_basic_type *basic_type;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        long value_length;
        char *name;

        /* nelems */
        if (read_length_value(product, offset, &string_length) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        value_length = (long)nelems;
        switch (nc_type)
        {
            case 1:
            case 2:
                break;
            case 3:
                value_length *= 2;
                break;
            case 4:
            case 5:
                value_length *= 4;
                break;
            case 6:
                value_length *= 8;
                break;
            default:
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
        }

        if (conversion != NULL)
        {
            if (nelems == 1 && (strcmp(name, "scale_factor") == 0 || strcmp(name, "add_offset") == 0))
            {
                if (nc_type == 5)
                {
                    float value;

                    if (read_bytes(product->raw_product, *offset, 4, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_float(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
                else if (nc_type == 6)
                {
                    double value;

                    if (read_bytes(product->raw_product, *offset, 8, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_double(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
            }
            /* note that missing_value has preference over _FillValue */
            /* We therefore don't modify fill_value for _FillValue if fill_value was already set */
            if (nelems == 1 && nc_type != 2 && (strcmp(name, "missing_value") == 0 ||
                                                (strcmp(name, "_FillValue") == 0 &&
                                                 coda_isNaN(conversion->invalid_value))))
            {
                union
                {
                    int8_t as_int8[8];
                    uint8_t as_uint8[8];
                    int16_t as_int16[4];
                    uint16_t as_uint16[4];
                    int32_t as_int32[2];
                    uint32_t as_uint32[2];
                    int64_t as_int64[1];
                    uint64_t as_uint64[1];
                    float as_float[2];
                    double as_double[1];
                } value;

                if (read_bytes(product->raw_product, *offset, value_length, value.as_int8) < 0)
                {
                    free(name);
                    coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                    return -1;
                }
                switch (nc_type)
                {
                    case 1:
                        conversion->invalid_value = (double)value.as_int8[0];
                        break;
                    case 3:
#ifndef WORDS_BIGENDIAN
                        swap_int16(value.as_int16);
#endif
                        conversion->invalid_value = (double)value.as_int16[0];
                        break;
                    case 4:
#ifndef WORDS_BIGENDIAN
                        swap_int32(value.as_int32);
#endif
                        conversion->invalid_value = (double)value.as_int32[0];
                        break;
                    case 5:
#ifndef WORDS_BIGENDIAN
                        swap_float(value.as_float);
#endif
                        conversion->invalid_value = (double)value.as_float[0];
                        break;
                    case 6:
#ifndef WORDS_BIGENDIAN
                        swap_double(value.as_double);
#endif
                        conversion->invalid_value = value.as_double[0];
                        break;
                    case 7:
                        conversion->invalid_value = (double)value.as_uint8[0];
                        break;
                    case 8:
#ifndef WORDS_BIGENDIAN
                        swap_uint16(value.as_uint16);
#endif
                        conversion->invalid_value = (double)value.as_uint16[0];
                        break;
                    case 9:
#ifndef WORDS_BIGENDIAN
                        swap_uint32(value.as_uint32);
#endif
                        conversion->invalid_value = (double)value.as_uint32[0];
                        break;
                    case 10:
#ifndef WORDS_BIGENDIAN
                        swap_int64(value.as_int64);
#endif
                        conversion->invalid_value = (double)value.as_int64[0];
                        break;
                    case 11:
#ifndef WORDS_BIGENDIAN
                        swap_uint64(value.as_uint64);
#endif
                        conversion->invalid_value = (double)value.as_uint64[0];
                        break;
                    default:
                        assert(0);
                        exit(1);
                }
            }
        }

        if (nc_type == 2)       /* treat char arrays as strings */
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, nelems);
        }
        else
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += value_length;
        if ((value_length & 3) != 0)
        {
            *offset += 4 - (value_length & 3);
        }

        if (nc_type == 2 || nelems == 1)
        {
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;
            long dim[CODA_MAX_NUM_DIMS];

            dim[0] = (long)nelems;
            array = coda_netcdf_array_new(1, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}